

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry.cpp
# Opt level: O3

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"hair_geometry","");
  SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
            (&this->super_SceneLoadingTutorialApplication,&local_38,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_SceneLoadingTutorialApplication).super_TutorialApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__SceneLoadingTutorialApplication_002c4d30;
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES) {}